

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

void __thiscall
QItemEditorFactory::registerEditor
          (QItemEditorFactory *this,int userType,QItemEditorCreatorBase *creator)

{
  long lVar1;
  const_iterator __last;
  const_iterator __first;
  const_iterator it_00;
  bool bVar2;
  QItemEditorCreatorBase **ppQVar3;
  QItemEditorCreatorBase *in_RDX;
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *in_RDI;
  long in_FS_OFFSET;
  iterator iVar4;
  QItemEditorCreatorBase *oldCreator;
  const_iterator it;
  int *in_stack_ffffffffffffff38;
  const_iterator *in_stack_ffffffffffffff40;
  const_iterator *in_stack_ffffffffffffff48;
  const_iterator *pcVar5;
  QHash<int,_QItemEditorCreatorBase_*> *in_stack_ffffffffffffff58;
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *pDVar6;
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *pDVar7;
  size_t in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = in_RDI;
  QHash<int,_QItemEditorCreatorBase_*>::constFind
            ((QHash<int,_QItemEditorCreatorBase_*> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  QHash<int,_QItemEditorCreatorBase_*>::cend
            ((QHash<int,_QItemEditorCreatorBase_*> *)in_stack_ffffffffffffff48);
  bVar2 = QHash<int,_QItemEditorCreatorBase_*>::const_iterator::operator!=
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (bVar2) {
    ppQVar3 = QHash<int,_QItemEditorCreatorBase_*>::const_iterator::value
                        ((const_iterator *)0x85760f);
    pcVar5 = (const_iterator *)*ppQVar3;
    it_00.i.bucket = in_stack_ffffffffffffffa8;
    it_00.i.d = in_stack_ffffffffffffffa0;
    iVar4 = QHash<int,_QItemEditorCreatorBase_*>::erase(in_stack_ffffffffffffff58,it_00);
    pDVar6 = (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)iVar4.i.bucket;
    QHash<int,_QItemEditorCreatorBase_*>::cbegin(in_stack_ffffffffffffff58);
    QHash<int,_QItemEditorCreatorBase_*>::cend
              ((QHash<int,_QItemEditorCreatorBase_*> *)in_stack_ffffffffffffff48);
    __first.i.bucket = in_stack_ffffffffffffff98;
    __first.i.d = pDVar7;
    __last.i.bucket = (size_t)in_RDX;
    __last.i.d = pDVar6;
    std::find<QHash<int,QItemEditorCreatorBase*>::const_iterator,QItemEditorCreatorBase*>
              (__first,__last,(QItemEditorCreatorBase **)in_stack_ffffffffffffff48);
    QHash<int,_QItemEditorCreatorBase_*>::cend
              ((QHash<int,_QItemEditorCreatorBase_*> *)in_stack_ffffffffffffff48);
    bVar2 = QHash<int,_QItemEditorCreatorBase_*>::const_iterator::operator==
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if ((bVar2) && (in_stack_ffffffffffffff48 = pcVar5, pcVar5 != (const_iterator *)0x0)) {
      (*(code *)((pcVar5->i).d)->size)();
      in_stack_ffffffffffffff48 = pcVar5;
    }
  }
  ppQVar3 = QHash<int,_QItemEditorCreatorBase_*>::operator[]
                      ((QHash<int,_QItemEditorCreatorBase_*> *)in_RDI,
                       (int *)in_stack_ffffffffffffff48);
  *ppQVar3 = in_RDX;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemEditorFactory::registerEditor(int userType, QItemEditorCreatorBase *creator)
{
    const auto it = creatorMap.constFind(userType);
    if (it != creatorMap.cend()) {
        QItemEditorCreatorBase *oldCreator = it.value();
        Q_ASSERT(oldCreator);
        creatorMap.erase(it);
        if (std::find(creatorMap.cbegin(), creatorMap.cend(), oldCreator) == creatorMap.cend())
            delete oldCreator; // if it is no more in use we can delete it
    }

    creatorMap[userType] = creator;
}